

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t *
Acb_DerivePatchSupport
          (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  sat_solver *psVar3;
  abctime aVar4;
  abctime aVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *vWeights;
  Vec_Int_t *pVVar6;
  long lVar7;
  abctime time;
  abctime time_00;
  abctime time_01;
  ulong uVar8;
  ulong uVar9;
  size_t __nmemb;
  int iVar10;
  uint uVar11;
  int iVar12;
  lit *plVar13;
  int Lit;
  timespec ts;
  int pLits [2];
  lit local_9c;
  timespec local_98;
  ulong local_88;
  long local_80;
  uint local_78;
  int local_74;
  sat_solver *local_70;
  ulong local_68;
  int local_5c;
  long local_58;
  ulong local_50;
  Vec_Int_t *local_48;
  Acb_Ntk_t *local_40;
  ulong local_38;
  
  local_88 = CONCAT44(local_88._4_4_,iTar);
  local_48 = vDivs;
  local_40 = pNtkF;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  iVar10 = pCnf->nVars;
  psVar3 = sat_solver_new();
  local_50 = (ulong)(uint)nCoDivs;
  sat_solver_setnvars(psVar3,nCoDivs + pCnf->nVars * 2);
  lVar7 = 0;
  while (lVar7 < pCnf->nClauses) {
    iVar1 = sat_solver_addclause(psVar3,pCnf->pClauses[lVar7],pCnf->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  local_9c = 2;
  iVar1 = sat_solver_addclause(psVar3,&local_9c,(lit *)&local_98);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar7 = 0;
  while (lVar7 < pCnf->nClauses) {
    iVar1 = sat_solver_addclause(psVar3,pCnf->pClauses[lVar7],pCnf->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  if (pCnf->nVars < -1) {
LAB_003989ec:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_9c = pCnf->nVars * 2 + 2;
  iVar1 = sat_solver_addclause(psVar3,&local_9c,(lit *)&local_98);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  iVar10 = (iVar10 - nTargets) + (int)local_88;
  if (iVar10 < 0) goto LAB_003989ec;
  local_9c = iVar10 * 2 + 1;
  iVar1 = sat_solver_addclause(psVar3,&local_9c,(lit *)&local_98);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  iVar10 = iVar10 + pCnf->nVars;
  if (iVar10 < 0) goto LAB_003989ec;
  local_9c = iVar10 * 2;
  iVar10 = sat_solver_addclause(psVar3,&local_9c,(lit *)&local_98);
  if (iVar10 == 0) {
    return (Vec_Int_t *)0x0;
  }
  if ((int)(uint)local_50 < 1) goto LAB_003989ac;
  iVar10 = clock_gettime(3,&local_98);
  if (iVar10 < 0) {
    local_58 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_98.tv_nsec._4_4_,(int)local_98.tv_nsec)),8);
    local_58 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) +
               CONCAT44(local_98.tv_sec._4_4_,(int)local_98.tv_sec) * -1000000;
  }
  local_88 = (ulong)(uint)pCnf->nVars;
  p->nSize = 0;
  if (vSuppOld != (Vec_Int_t *)0x0) {
    local_70 = psVar3;
    if (vSuppOld->nSize < 1) {
      lVar7 = 0;
    }
    else {
      lVar7 = 0;
      do {
        psVar3 = local_70;
        if (vSuppOld->pArray[lVar7] < -2) goto LAB_003989ec;
        iVar1 = vSuppOld->pArray[lVar7] + 2;
        iVar10 = pCnf->nVars + iVar1;
        uVar11 = iVar1 * 2;
        local_80 = lVar7;
        local_78 = uVar11;
        if (iVar10 < 0) goto LAB_003989ec;
        local_74 = iVar10 * 2 + 1;
        iVar1 = sat_solver_addclause(local_70,(lit *)&local_78,(lit *)&local_70);
        if (iVar1 == 0) {
LAB_003985ce:
          puts("Unsat is detected earlier.");
          lVar7 = local_80;
          break;
        }
        local_74 = iVar10 * 2;
        local_78 = uVar11 | 1;
        iVar10 = sat_solver_addclause(psVar3,(lit *)&local_78,(lit *)&local_70);
        if (iVar10 == 0) goto LAB_003985ce;
        lVar7 = local_80 + 1;
      } while (lVar7 < vSuppOld->nSize);
    }
    psVar3 = local_70;
    if ((int)lVar7 != vSuppOld->nSize) goto LAB_003989ac;
  }
  uVar8 = (ulong)(uint)((int)local_88 * 2);
  plVar13 = (lit *)((long)&local_98.tv_nsec + 4);
  local_88 = (ulong)(uint)((int)local_88 << 2);
  uVar9 = 0;
  iVar10 = 4;
  local_68 = uVar8;
  do {
    iVar1 = (int)uVar9 + pCnf->nVars;
    uVar11 = iVar1 + 2;
    local_38 = uVar9;
    if ((int)((int)uVar8 + (int)uVar9 | uVar11) < 0) {
      __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    iVar12 = (int)local_88 + iVar10 + -3;
    local_98.tv_sec._4_4_ = iVar10 + 1;
    local_80 = CONCAT44(local_80._4_4_,local_98.tv_sec._4_4_);
    local_98.tv_nsec._0_4_ = iVar1 + 3 + uVar11;
    local_70 = (sat_solver *)CONCAT44(local_70._4_4_,(int)local_98.tv_nsec);
    local_98.tv_sec._0_4_ = iVar12;
    iVar1 = sat_solver_addclause(psVar3,(lit *)&local_98,plVar13);
    if (iVar1 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_98.tv_sec._0_4_ = iVar12;
    local_98.tv_sec._4_4_ = iVar10;
    local_98.tv_nsec._0_4_ = uVar11 * 2;
    local_5c = iVar12;
    iVar1 = sat_solver_addclause(psVar3,(lit *)&local_98,plVar13);
    if (iVar1 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    iVar12 = (int)local_88 + iVar10 + -4;
    local_98.tv_sec._4_4_ = (undefined4)local_80;
    local_98.tv_sec._0_4_ = iVar12;
    local_98.tv_nsec._0_4_ = uVar11 * 2;
    iVar1 = sat_solver_addclause(psVar3,(lit *)&local_98,plVar13);
    if (iVar1 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    local_98.tv_nsec._0_4_ = local_70._0_4_;
    local_98.tv_sec._0_4_ = iVar12;
    local_98.tv_sec._4_4_ = iVar10;
    iVar1 = sat_solver_addclause(psVar3,(lit *)&local_98,plVar13);
    uVar8 = local_68;
    if (iVar1 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                    ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
    }
    if ((int)local_68 < 0) goto LAB_003989ec;
    Vec_IntPush(p,local_5c);
    uVar11 = (int)local_38 + 1;
    uVar9 = (ulong)uVar11;
    iVar10 = iVar10 + 2;
  } while ((uint)local_50 != uVar11);
  if (TimeOut == 0) {
    plVar13 = p->pArray;
    iVar10 = p->nSize;
    iVar1 = sat_solver_solve(psVar3,plVar13,plVar13 + iVar10,0,0,0,0);
  }
  else {
    aVar4 = Abc_Clock();
    psVar3->nRuntimeLimit = aVar4 + (long)TimeOut * 1000000;
    plVar13 = p->pArray;
    iVar10 = p->nSize;
    iVar1 = sat_solver_solve(psVar3,plVar13,plVar13 + iVar10,0,0,0,0);
    psVar3->nRuntimeLimit = 0;
  }
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      printf("Support computation timed out after %d sec.\n",(ulong)(uint)TimeOut);
    }
    else {
      if (iVar1 != 1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                      ,0x51a,
                      "Vec_Int_t *Acb_DerivePatchSupport(Cnf_Dat_t *, int, int, int, Vec_Int_t *, Acb_Ntk_t *, Vec_Int_t *, int)"
                     );
      }
      puts("ECO does not exist.");
    }
    sat_solver_delete(psVar3);
    Vec_IntFree(p);
    return (Vec_Int_t *)0x0;
  }
  printf("Proved that the problem has a solution.  ");
  aVar4 = Abc_Clock();
  Abc_PrintTime(0xa0ce9c,(char *)(local_58 + aVar4),time);
  aVar4 = Abc_Clock();
  uVar11 = sat_solver_minimize_assumptions(psVar3,plVar13,iVar10,0);
  if (iVar10 < (int)uVar11) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  p->nSize = uVar11;
  qsort(plVar13,(long)(int)uVar11,4,Vec_IntSortCompare1);
  printf("Found one feasible set of %d divisors.  ",(ulong)uVar11);
  aVar5 = Abc_Clock();
  Abc_PrintTime(0xa0ce9c,(char *)(aVar5 - aVar4),time_00);
  p_00 = p;
  if ((int)uVar11 < 1) {
LAB_00398994:
    piVar2 = p_00->pArray;
    __nmemb = (size_t)(int)uVar11;
  }
  else {
    aVar4 = Abc_Clock();
    p_00 = Vec_IntDup(p);
    vWeights = Acb_DeriveWeights(local_48,local_40);
    pVVar6 = Acb_FindSupport(psVar3,(int)local_68,vWeights,p,TimeOut);
    Vec_IntFree(vWeights);
    Vec_IntFree(p);
    if (pVVar6 == (Vec_Int_t *)0x0) {
      printf("Support minimization did not succeed.  ");
    }
    else {
      Vec_IntFree(p_00);
      printf("Minimized support to %d supp vars.  ",(ulong)(uint)pVVar6->nSize);
      p_00 = pVVar6;
    }
    aVar5 = Abc_Clock();
    Abc_PrintTime(0xa0ce9c,(char *)(aVar5 - aVar4),time_01);
    uVar11 = p_00->nSize;
    if ((int)uVar11 < 1) goto LAB_00398994;
    piVar2 = p_00->pArray;
    lVar7 = 0;
    do {
      if (piVar2[lVar7] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      piVar2[lVar7] = ((uint)piVar2[lVar7] >> 1) - (int)local_68;
      lVar7 = lVar7 + 1;
      __nmemb = (size_t)p_00->nSize;
    } while (lVar7 < (long)__nmemb);
  }
  qsort(piVar2,__nmemb,4,Vec_IntSortCompare1);
  p = p_00;
LAB_003989ac:
  sat_solver_delete(psVar3);
  if (p == (Vec_Int_t *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  qsort(p->pArray,(long)p->nSize,4,Vec_IntSortCompare1);
  return p;
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupport( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nTargets;
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * pCnf->nVars + nCoDivs );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for targets
    // add negative literal
    Lit = Abc_Var2Lit( iCiVarBeg + iTar, 1 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add positive literal
    Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars + iTar, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, nSuppNew, status;
        int iDivVar = 2 * pCnf->nVars;
        int pLits[2];
        int j = 0, iDivOld;
        Vec_IntClear( vSupp );
        if ( vSuppOld )
        {
            // start with predefined support
            Vec_IntForEachEntry( vSuppOld, iDivOld, j )
            {
                int iVar0 = iCoVarBeg+1+iDivOld;
                int iVar1 = iCoVarBeg+1+iDivOld+pCnf->nVars;
                //printf( "Selecting predefined divisor %d with weight %d\n", 
                //    iDivOld, Vec_IntEntry(&pNtkF->vObjWeight, Vec_IntEntry(vDivs, iDivOld)) );
                // add equality clauses
                pLits[0] = Abc_Var2Lit( iVar0, 0 );
                pLits[1] = Abc_Var2Lit( iVar1, 1 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
                pLits[0] = Abc_Var2Lit( iVar0, 1 );
                pLits[1] = Abc_Var2Lit( iVar1, 0 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
            }
        }
        if ( vSuppOld == NULL || j == Vec_IntSize(vSuppOld) )
        {
            for ( i = 0; i < nCoDivs; i++ )
            {
                sat_solver_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
            }
            // try one run
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, TimeOut * CLOCKS_PER_SEC + Abc_Clock() );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, 0 );
            if ( status == l_True )
            {
                printf( "ECO does not exist.\n" );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            if ( status == l_Undef )
            {
                printf( "Support computation timed out after %d sec.\n", TimeOut );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            assert( status == l_False );
            printf( "Proved that the problem has a solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            // find minimum subset
            if ( fUseMinAssump )
            {
                int fUseSuppMin = 1;
                // solve in a standard way
                abctime clk = Abc_Clock();
                nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
                Vec_IntShrink( vSupp, nSuppNew );
                Vec_IntSort( vSupp, 0 );
                printf( "Found one feasible set of %d divisors.  ", Vec_IntSize(vSupp) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

                // perform minimization
                if ( fUseSuppMin && Vec_IntSize(vSupp) > 0 )
                {
                    abctime clk = Abc_Clock();
                    Vec_Int_t * vSupp2 = Vec_IntDup( vSupp );
                    Vec_Int_t * vTemp, * vWeights = Acb_DeriveWeights( vDivs, pNtkF );
                    vSupp = Acb_FindSupport( pSat, iDivVar, vWeights, vTemp = vSupp, TimeOut );
                    Vec_IntFree( vWeights );
                    Vec_IntFree( vTemp );
                    if ( vSupp == NULL )
                    {
                        printf( "Support minimization did not succeed.  " );
                        //sat_solver_delete( pSat );
                        vSupp = vSupp2;
                    }
                    else
                    {
                        Vec_IntFree( vSupp2 );
                        printf( "Minimized support to %d supp vars.  ", Vec_IntSize(vSupp) );
                    }
                    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
                }
            }
            else
            {
                int * pFinal, nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
                Vec_IntClear( vSupp ); 
                for ( i = 0; i < nFinal; i++ )
                    Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
                // try one run
                status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
                assert( status == l_False );
                // try again
                nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            }
            // remap them into numbers
            Vec_IntForEachEntry( vSupp, iLit, i )
                Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
            Vec_IntSort( vSupp, 0 );
        }
    }
    sat_solver_delete( pSat );
    if ( vSupp ) Vec_IntSort( vSupp, 0 );
    return vSupp;
}